

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

void __thiscall slang::JsonWriter::writeProperty(JsonWriter *this,string_view name)

{
  pointer __str;
  FormatBuffer *in_RDI;
  JsonWriter *in_stack_00000070;
  undefined1 in_stack_00000078 [16];
  string_view in_stack_ffffffffffffffb8;
  
  writeQuoted(in_stack_00000070,(string_view)in_stack_00000078);
  __str = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
          operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                     0x58188a);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)__str);
  FormatBuffer::append(in_RDI,in_stack_ffffffffffffffb8);
  if (((in_RDI->buf).super_buffer<char>.capacity_ & 1) != 0) {
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0x5818c9);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)__str);
    FormatBuffer::append(in_RDI,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void JsonWriter::writeProperty(std::string_view name) {
    writeQuoted(name);
    buffer->append(":");
    if (pretty)
        buffer->append(" ");
}